

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_get(Table *t,TValue *key)

{
  int iVar1;
  TValue *pTVar2;
  lua_Integer local_28;
  lua_Integer k;
  TValue *key_local;
  Table *t_local;
  
  k = (lua_Integer)key;
  key_local = (TValue *)t;
  switch(key->tt_ & 0x3f) {
  case 0:
    t_local = (Table *)&luaO_nilobject_;
    break;
  case 3:
    iVar1 = luaV_tointeger(key,&local_28,0);
    if (iVar1 != 0) {
      pTVar2 = luaH_getint((Table *)key_local,local_28);
      return pTVar2;
    }
  default:
    t_local = (Table *)getgeneric((Table *)key_local,(TValue *)k);
    break;
  case 4:
    t_local = (Table *)luaH_getshortstr(t,(TString *)(key->value_).gc);
    break;
  case 0x13:
    t_local = (Table *)luaH_getint(t,(key->value_).i);
  }
  return (TValue *)t_local;
}

Assistant:

const TValue *luaH_get (Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TSHRSTR: return luaH_getshortstr(t, tsvalue(key));
    case LUA_TNUMINT: return luaH_getint(t, ivalue(key));
    case LUA_TNIL: return luaO_nilobject;
    case LUA_TNUMFLT: {
      lua_Integer k;
      if (luaV_tointeger(key, &k, 0)) /* index is int? */
        return luaH_getint(t, k);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      return getgeneric(t, key);
  }
}